

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  void *__dest;
  void *dictBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->streamStage == zcss_init) {
    if (cctx->staticSize == 0) {
      ZSTD_clearAllDicts(cctx);
      if ((dict == (void *)0x0) || (dictSize == 0)) {
        cctx_local = (ZSTD_CCtx *)0x0;
      }
      else {
        if (dictLoadMethod == ZSTD_dlm_byRef) {
          (cctx->localDict).dict = dict;
        }
        else {
          __dest = ZSTD_malloc(dictSize,cctx->customMem);
          if (__dest == (void *)0x0) {
            return 0xffffffffffffffc0;
          }
          memcpy(__dest,dict,dictSize);
          (cctx->localDict).dictBuffer = __dest;
          (cctx->localDict).dict = __dest;
        }
        (cctx->localDict).dictSize = dictSize;
        (cctx->localDict).dictContentType = dictContentType;
        cctx_local = (ZSTD_CCtx *)0x0;
      }
    }
    else {
      cctx_local = (ZSTD_CCtx *)0xffffffffffffffc0;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong);
    RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                    "no malloc for static CCtx");
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_clearAllDicts(cctx);  /* in case one already exists */
    if (dict == NULL || dictSize == 0)  /* no dictionary mode */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        void* dictBuffer = ZSTD_malloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(!dictBuffer, memory_allocation);
        memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;
        cctx->localDict.dict = dictBuffer;
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}